

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O0

void __thiscall FParser::OPand(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  uint local_28;
  int exprtrue;
  int stop_local;
  int n_local;
  int start_local;
  svalue_t *result_local;
  FParser *this_local;
  
  EvaluateExpression(this,result,start,n + -1);
  iVar1 = intvalue(result);
  if (iVar1 == 0) {
    local_28 = 0;
  }
  else {
    EvaluateExpression(this,result,n + 1,stop);
    iVar1 = intvalue(result);
    local_28 = (uint)(iVar1 != 0);
  }
  result->type = 1;
  (result->value).i = local_28;
  return;
}

Assistant:

void FParser::OPand(svalue_t &result, int start, int n, int stop)
{
	int exprtrue = true;
	// if first is false, do not eval second
	
	EvaluateExpression(result, start, n-1);
	
	if(!intvalue(result) )
		exprtrue = false;
	else
    {
		EvaluateExpression(result, n+1, stop);
		exprtrue = !!intvalue(result);
    }
	
	result.type = svt_int;
	result.value.i = exprtrue;
}